

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sat.cpp
# Opt level: O2

bool __thiscall SAT::propagate(SAT *this)

{
  anon_union_8_2_743a5d44_for_Reason_0 *paVar1;
  char cVar2;
  uint uVar3;
  int *piVar4;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  Clause *pCVar5;
  char cVar6;
  anon_union_8_2_743a5d44_for_Reason_0 *paVar7;
  Lit *pLVar8;
  Lit *pLVar9;
  uint uVar10;
  ulong uVar11;
  Lit q;
  Lit p;
  vec<Lit> *pvVar12;
  uint uVar13;
  uint uVar14;
  vec<WatchElem> *pvVar15;
  anon_union_8_2_743a5d44_for_Reason_0 *paVar16;
  anon_union_8_2_743a5d44_for_Reason_0 *paVar17;
  anon_union_8_2_743a5d44_for_Reason_0 local_38;
  
  piVar4 = (this->qhead).data;
  uVar13 = (this->qhead).sz - 1;
  pvVar12 = (this->trail).data + ((this->trail).sz - 1);
  uVar14 = 0;
  do {
    do {
      uVar3 = piVar4[uVar13];
      if ((int)pvVar12->sz <= (int)uVar3) {
        this->propagations = this->propagations + (ulong)uVar14;
        return this->confl == (Clause *)0x0;
      }
      uVar14 = uVar14 + 1;
      piVar4[uVar13] = uVar3 + 1;
      uVar3 = pvVar12->data[uVar3].x;
      pvVar15 = (this->watches).data;
      uVar11 = (ulong)pvVar15[uVar3].sz;
    } while (uVar11 == 0);
    pvVar15 = pvVar15 + uVar3;
    paVar17 = (anon_union_8_2_743a5d44_for_Reason_0 *)pvVar15->data;
    paVar1 = paVar17 + uVar11;
    paVar7 = paVar17;
LAB_0019b675:
    if (paVar7 != paVar1) {
      r._a = (uint64_t)paVar7->_pt;
      uVar10 = r._0_4_ & 3;
      paVar16 = paVar7 + 1;
      if (uVar10 == 2) {
        paVar17->_pt = (Clause *)r;
        paVar17 = paVar17 + 1;
        (*engine.propagators.data[paVar7->_a >> 0x20]->_vptr_Propagator[2])
                  (engine.propagators.data[paVar7->_a >> 0x20],paVar7->_a >> 2 & 0x3fffffff,0);
        paVar7 = paVar16;
      }
      else {
        q.x = (int)((long)(int)uVar3 ^ 1U);
        if (uVar10 == 1) {
          paVar17->_pt = (Clause *)r;
          paVar17 = paVar17 + 1;
          pCVar5 = paVar7->_pt;
          cVar2 = (this->assigns).data[(long)pCVar5 >> 0x21 & 0xffffffff];
          cVar6 = -cVar2;
          if (((ulong)pCVar5 >> 0x20 & 1) == 0) {
            cVar6 = cVar2;
          }
          p.x = (int)((ulong)pCVar5 >> 0x20);
          if (cVar6 == -1) {
            setConfl(this,p,q);
            piVar4[uVar13] = pvVar12->sz;
            for (; paVar7 = paVar16, paVar16 < paVar1; paVar16 = paVar16 + 1) {
              paVar17->_pt = (Clause *)*(Clause **)paVar16;
              paVar17 = paVar17 + 1;
            }
          }
          else {
            paVar7 = paVar16;
            if (cVar6 == '\0') {
              enqueue(this,p,(Reason)(((long)(int)uVar3 ^ 1U) * 4 + 2));
            }
          }
          goto LAB_0019b675;
        }
        pLVar8 = Clause::operator[]((Clause *)r,0);
        cVar2 = (this->assigns).data[(uint)(pLVar8->x >> 1)];
        cVar6 = -cVar2;
        if ((pLVar8->x & 1U) == 0) {
          cVar6 = cVar2;
        }
        if (cVar6 != ::l_True.value) {
          pLVar8 = Clause::operator[]((Clause *)r,1);
          cVar2 = (this->assigns).data[(uint)(pLVar8->x >> 1)];
          cVar6 = -cVar2;
          if ((pLVar8->x & 1U) == 0) {
            cVar6 = cVar2;
          }
          if (cVar6 != ::l_True.value) {
            pLVar8 = Clause::operator[]((Clause *)r,0);
            if (pLVar8->x == q.x) {
              pLVar8 = Clause::operator[]((Clause *)r,1);
              pLVar9 = Clause::operator[]((Clause *)r,0);
              pLVar9->x = pLVar8->x;
              pLVar8 = Clause::operator[]((Clause *)r,1);
              pLVar8->x = q.x;
            }
            for (uVar10 = 2; uVar10 < *(uint *)r >> 8; uVar10 = uVar10 + 1) {
              pLVar8 = Clause::operator[]((Clause *)r,uVar10);
              cVar2 = (this->assigns).data[(uint)(pLVar8->x >> 1)];
              cVar6 = -cVar2;
              if ((pLVar8->x & 1U) == 0) {
                cVar6 = cVar2;
              }
              if (cVar6 != ::l_False.value) {
                pLVar8 = Clause::operator[]((Clause *)r,uVar10);
                pLVar9 = Clause::operator[]((Clause *)r,1);
                pLVar9->x = pLVar8->x;
                pLVar8 = Clause::operator[]((Clause *)r,uVar10);
                pLVar8->x = q.x;
                pLVar8 = Clause::operator[]((Clause *)r,1);
                local_38._a = r._a;
                vec<WatchElem>::push
                          ((this->watches).data + ((ulong)(uint)pLVar8->x ^ 1),
                           (WatchElem *)&local_38);
                paVar7 = paVar16;
                goto LAB_0019b675;
              }
            }
            paVar17->_pt = (Clause *)r;
            paVar17 = paVar17 + 1;
            pLVar8 = Clause::operator[]((Clause *)r,0);
            cVar2 = (this->assigns).data[(uint)(pLVar8->x >> 1)];
            cVar6 = -cVar2;
            if ((pLVar8->x & 1U) == 0) {
              cVar6 = cVar2;
            }
            if (cVar6 == ::l_False.value) {
              this->confl = (Clause *)r;
              piVar4[uVar13] = pvVar12->sz;
              for (; paVar7 = paVar16, paVar16 < paVar1; paVar16 = paVar16 + 1) {
                paVar17->_pt = (Clause *)*(Clause **)paVar16;
                paVar17 = paVar17 + 1;
              }
            }
            else {
              pLVar8 = Clause::operator[]((Clause *)r,0);
              enqueue(this,(Lit)pLVar8->x,(Reason)r);
              paVar7 = paVar16;
            }
            goto LAB_0019b675;
          }
        }
        paVar17->_pt = (Clause *)r;
        paVar17 = paVar17 + 1;
        paVar7 = paVar16;
      }
      goto LAB_0019b675;
    }
    pvVar15->sz = pvVar15->sz - (int)((ulong)((long)paVar1 - (long)paVar17) >> 3);
  } while( true );
}

Assistant:

bool SAT::propagate() {
	int num_props = 0;

	int& qhead = this->qhead.last();
	vec<Lit>& trail = this->trail.last();

	while (qhead < static_cast<int>(trail.size())) {
		num_props++;

		const Lit p = trail[qhead++];  // 'p' is enqueued fact to propagate.
		vec<WatchElem>& ws = watches[toInt(p)];

		if (ws.size() == 0) {
			continue;
		}

		WatchElem* i;
		WatchElem* j;
		WatchElem* end;

		for (i = j = ws, end = i + ws.size(); i != end;) {
			const WatchElem& we = *i;
			switch (we.type()) {
				case 1: {
					// absorbed binary clause
					*j++ = *i++;
					const Lit q = toLit(we.d2());
					switch (toInt(value(q))) {
						case 0:
							enqueue(q, ~p);
							break;
						case -1:
							setConfl(q, ~p);
							qhead = trail.size();
							while (i < end) {
								*j++ = *i++;
							}
							break;
						default:;
					}
					continue;
				}
				case 2: {
					// wake up FD propagator
					*j++ = *i++;
					engine.propagators[we.d2()]->wakeup(we.d1(), 0);
					continue;
				}
				default:
					Clause& c = *we.pt();
					i++;

					// Check if already satisfied
					if (value(c[0]) == l_True || value(c[1]) == l_True) {
						*j++ = &c;
						continue;
					}

					const Lit false_lit = ~p;

					// Make sure the false literal is data[1]:
					if (c[0] == false_lit) {
						c[0] = c[1], c[1] = false_lit;
					}

					// Look for new watch:
					for (unsigned int k = 2; k < c.size(); k++) {
						if (value(c[k]) != l_False) {
							c[1] = c[k];
							c[k] = false_lit;
							watches[toInt(~c[1])].push(&c);
							goto FoundWatch;
						}
					}

					// Did not find watch -- clause is unit under assignment:
					*j++ = &c;
					if (value(c[0]) == l_False) {
						confl = &c;
						qhead = trail.size();
						while (i < end) {
							*j++ = *i++;
						}
					} else {
						enqueue(c[0], &c);
					}
				FoundWatch:;
			}
		}
		ws.shrink(static_cast<int>(i - j));
	}
	propagations += num_props;

	return (confl == nullptr);
}